

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O1

ScalarFunction * duckdb::ConcatWsFun::GetFunction(void)

{
  LogicalType varargs;
  bind_scalar_function_t *pp_Var1;
  ScalarFunction *in_RDI;
  bind_scalar_function_t *pp_Var2;
  long lVar3;
  scalar_function_t *__x;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd4;
  FunctionNullHandling in_stack_fffffffffffffde0;
  allocator_type local_219;
  code *bind_lambda;
  LogicalType local_1f8 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1b0;
  string local_198;
  LogicalType local_168;
  ScalarFunction local_150;
  
  bVar4 = 0;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"concat_ws","");
  LogicalType::LogicalType(local_1f8,VARCHAR);
  LogicalType::LogicalType(local_1f8 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_1f8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_1b0,__l,&local_219);
  LogicalType::LogicalType(local_1f8 + 2,VARCHAR);
  bind_lambda = ConcatWSFunction;
  LogicalType::LogicalType(&local_168,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_168;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffdcc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffdd4;
  ScalarFunction::ScalarFunction
            (&local_150,&local_198,(vector<duckdb::LogicalType,_true> *)&local_1b0,local_1f8 + 2,
             (scalar_function_t *)&stack0xfffffffffffffde8,BindConcatWSFunction,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffde0,bind_lambda);
  LogicalType::~LogicalType(&local_168);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffde8,(_Any_data *)&stack0xfffffffffffffde8,
               __destroy_functor);
  LogicalType::~LogicalType(local_1f8 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1b0);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_1f8[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  LogicalType::LogicalType(local_1f8,ANY);
  LogicalType::~LogicalType(local_1f8);
  local_150.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  SimpleFunction::SimpleFunction((SimpleFunction *)in_RDI,(SimpleFunction *)&local_150);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_019937c0;
  LogicalType::LogicalType
            (&(in_RDI->super_BaseScalarFunction).return_type,
             &local_150.super_BaseScalarFunction.return_type);
  (in_RDI->super_BaseScalarFunction).stability = local_150.super_BaseScalarFunction.stability;
  (in_RDI->super_BaseScalarFunction).null_handling =
       local_150.super_BaseScalarFunction.null_handling;
  (in_RDI->super_BaseScalarFunction).errors = local_150.super_BaseScalarFunction.errors;
  (in_RDI->super_BaseScalarFunction).collation_handling =
       local_150.super_BaseScalarFunction.collation_handling;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  __x = &local_150.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (&in_RDI->function,__x);
  pp_Var1 = &local_150.bind;
  pp_Var2 = &in_RDI->bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var2 = *pp_Var1;
    pp_Var1 = pp_Var1 + (ulong)bVar4 * -2 + 1;
    pp_Var2 = pp_Var2 + (ulong)bVar4 * -2 + 1;
  }
  (in_RDI->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_150.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_150.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_150.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_150.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_150.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_150.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

ScalarFunction ConcatWsFun::GetFunction() {
	// concat_ws functions similarly to the concat function, except the result is NULL if the separator is NULL
	// if the separator is not NULL, however, NULL values are counted as empty string
	// there is one separate rule: there are no separators added between NULL values,
	// so the NULL value and empty string are different!
	// e.g.:
	// concat_ws(',', NULL, NULL) = ""
	// concat_ws(',', '', '') = ","

	ScalarFunction concat_ws = ScalarFunction("concat_ws", {LogicalType::VARCHAR, LogicalType::ANY},
	                                          LogicalType::VARCHAR, ConcatWSFunction, BindConcatWSFunction);
	concat_ws.varargs = LogicalType::ANY;
	concat_ws.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return ScalarFunction(concat_ws);
}